

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPreservingSwapTests.cpp
# Opt level: O2

int __thiscall deqp::egl::PreservingSwapTests::init(PreservingSwapTests *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  _Alloc_hider str;
  deUint32 dVar3;
  undefined8 in_RAX;
  TestCaseGroup *this_00;
  TestCaseGroup *this_01;
  TestCase *this_02;
  undefined8 extraout_RAX;
  long lVar4;
  char *pcVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  string name;
  ostringstream local_1a8 [376];
  
  iVar9 = 0;
  do {
    if (iVar9 == 2) {
      return (int)in_RAX;
    }
    this_00 = (TestCaseGroup *)operator_new(0x78);
    pcVar5 = "no_preserve";
    if (iVar9 == 0) {
      pcVar5 = "preserve";
    }
    TestCaseGroup::TestCaseGroup(this_00,(this->super_TestCaseGroup).m_eglTestCtx,pcVar5,"");
    for (iVar6 = 0; iVar6 != 2; iVar6 = iVar6 + 1) {
      this_01 = (TestCaseGroup *)operator_new(0x78);
      pcVar5 = "no_read_before_swap";
      if (iVar6 == 1) {
        pcVar5 = "read_before_swap";
      }
      TestCaseGroup::TestCaseGroup(this_01,(this->super_TestCaseGroup).m_eglTestCtx,pcVar5,"");
      for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
        iVar1 = (&DAT_0032ab20)[lVar4];
        uVar8 = 0xffffffff;
        for (lVar7 = 0; lVar7 != 0xc; lVar7 = lVar7 + 4) {
          if (iVar9 == 0 || lVar7 != 0) {
            iVar2 = *(int *)((long)&DAT_0032ab20 + lVar7);
            std::__cxx11::ostringstream::ostringstream(local_1a8);
            pcVar5 = "no_draw";
            if (iVar2 == 0 && iVar1 == 0) {
LAB_0020d343:
              std::operator<<((ostream *)local_1a8,pcVar5);
            }
            else {
              pcVar5 = "pre_render";
              if (iVar1 == 2) {
LAB_0020d308:
                std::operator<<((ostream *)local_1a8,pcVar5);
              }
              else if (iVar1 == 1) {
                pcVar5 = "pre_clear";
                goto LAB_0020d308;
              }
              if ((uVar8 | (int)lVar4 - 1U) < 2) {
                std::operator<<((ostream *)local_1a8,"_");
              }
              pcVar5 = "post_render";
              if (iVar2 == 2) goto LAB_0020d343;
              if (iVar2 == 1) {
                pcVar5 = "post_clear";
                goto LAB_0020d343;
              }
            }
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream(local_1a8);
            this_02 = (TestCase *)operator_new(0x1ae8);
            str = name._M_dataplus;
            TestCase::TestCase(this_02,(this->super_TestCaseGroup).m_eglTestCtx,
                               name._M_dataplus._M_p,"");
            (this_02->super_TestCase).super_TestNode._vptr_TestNode =
                 (_func_int **)&PTR__PreservingSwapTest_003d7840;
            dVar3 = deStringHash(str._M_p);
            *(deUint32 *)&this_02[1].super_TestCase.super_TestNode._vptr_TestNode = dVar3;
            *(byte *)((long)&this_02[1].super_TestCase.super_TestNode._vptr_TestNode + 4) =
                 (byte)iVar9 ^ 1;
            *(bool *)((long)&this_02[1].super_TestCase.super_TestNode._vptr_TestNode + 5) =
                 iVar6 == 1;
            *(int *)&this_02[1].super_TestCase.super_TestNode.m_testCtx = iVar1;
            *(int *)((long)&this_02[1].super_TestCase.super_TestNode.m_testCtx + 4) = iVar2;
            this_02[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p = (pointer)0x0;
            this_02[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
            this_02[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
            this_02[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
            glw::Functions::Functions
                      ((Functions *)
                       &this_02[1].super_TestCase.super_TestNode.m_description._M_string_length);
            this_02[0x39].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
            *(undefined8 *)((long)&this_02[0x39].super_TestCase.super_TestNode.m_name.field_2 + 8) =
                 0;
            tcu::TestNode::addChild((TestNode *)this_01,(TestNode *)this_02);
            std::__cxx11::string::~string((string *)&name);
          }
          uVar8 = uVar8 + 1;
        }
      }
      tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)this_01);
    }
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    iVar9 = iVar9 + 1;
    in_RAX = extraout_RAX;
  } while( true );
}

Assistant:

void PreservingSwapTests::init (void)
{
	const PreservingSwapTest::DrawType preSwapDrawTypes[] =
	{
		PreservingSwapTest::DRAWTYPE_NONE,
		PreservingSwapTest::DRAWTYPE_GLES2_CLEAR,
		PreservingSwapTest::DRAWTYPE_GLES2_RENDER
	};

	const PreservingSwapTest::DrawType postSwapDrawTypes[] =
	{
		PreservingSwapTest::DRAWTYPE_NONE,
		PreservingSwapTest::DRAWTYPE_GLES2_CLEAR,
		PreservingSwapTest::DRAWTYPE_GLES2_RENDER
	};

	for (int preserveNdx = 0; preserveNdx < 2; preserveNdx++)
	{
		const bool				preserve		= (preserveNdx == 0);
		TestCaseGroup* const	preserveGroup	= new TestCaseGroup(m_eglTestCtx, (preserve ? "preserve" : "no_preserve"), "");

		for (int readPixelsNdx = 0; readPixelsNdx < 2; readPixelsNdx++)
		{
			const bool				readPixelsBeforeSwap		= (readPixelsNdx == 1);
			TestCaseGroup* const	readPixelsBeforeSwapGroup	= new TestCaseGroup(m_eglTestCtx, (readPixelsBeforeSwap ? "read_before_swap" : "no_read_before_swap"), "");

			for (int preSwapDrawTypeNdx = 0; preSwapDrawTypeNdx < DE_LENGTH_OF_ARRAY(preSwapDrawTypes); preSwapDrawTypeNdx++)
			{
				const PreservingSwapTest::DrawType preSwapDrawType = preSwapDrawTypes[preSwapDrawTypeNdx];

				for (int postSwapDrawTypeNdx = 0; postSwapDrawTypeNdx < DE_LENGTH_OF_ARRAY(postSwapDrawTypes); postSwapDrawTypeNdx++)
				{
					const PreservingSwapTest::DrawType postSwapDrawType = postSwapDrawTypes[postSwapDrawTypeNdx];

					// If not preserving and rendering after swap, then there is nothing to verify
					if (!preserve && postSwapDrawType == PreservingSwapTest::DRAWTYPE_NONE)
						continue;

					const std::string name = generateTestName(preSwapDrawType, postSwapDrawType);

					readPixelsBeforeSwapGroup->addChild(new PreservingSwapTest(m_eglTestCtx, preserve, readPixelsBeforeSwap, preSwapDrawType, postSwapDrawType, name.c_str(), ""));
				}
			}

			preserveGroup->addChild(readPixelsBeforeSwapGroup);
		}

		addChild(preserveGroup);
	}
}